

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

bool mjs::anon_unknown_2::is_identifier_part_v5(int ch)

{
  classification cVar1;
  bool bVar2;
  
  cVar1 = classify(ch);
  bVar2 = true;
  if (1 < cVar1 - 1) {
    if (cVar1 == format) {
      bVar2 = (ch & 0xfffffffeU) == 0x200c;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

constexpr bool is_identifier_part_v5(int ch) {
    switch (classify(ch)) {
    case unicode::classification::id_start:
    case unicode::classification::id_part:
        return true;
    case unicode::classification::format:
        // ES5.1, \u200c (<ZWNJ>) and \u200d (<ZWJ>) are considered identifier parts outside literals/comments/etc.
        return ch == unicode_ZWNJ || ch == unicode_ZWJ;
    default:
        return false;
    }
}